

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O2

calendar * __thiscall booster::locale::calendar::operator=(calendar *this,calendar *other)

{
  abstract_calendar *paVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (this != other) {
    iVar2 = (**((other->impl_).ptr_)->_vptr_abstract_calendar)();
    paVar1 = (this->impl_).ptr_;
    if (paVar1 != (abstract_calendar *)0x0) {
      (*paVar1->_vptr_abstract_calendar[0xe])();
    }
    (this->impl_).ptr_ = (abstract_calendar *)CONCAT44(extraout_var,iVar2);
    std::locale::operator=(&this->locale_,&other->locale_);
    std::__cxx11::string::_M_assign((string *)&this->tz_);
  }
  return this;
}

Assistant:

calendar const &calendar::operator = (calendar const &other) 
{
    if(this !=&other) {
        impl_.reset(other.impl_->clone());
        locale_ = other.locale_;
        tz_ = other.tz_;
    }
    return *this;
}